

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

string * __thiscall
jsoncons::jsonpath::detail::
tokenize_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
to_string_abi_cxx11_
          (tokenize_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,int level)

{
  int in_EDX;
  string *in_RDI;
  string *s;
  
  std::__cxx11::string::string((string *)in_RDI);
  if (0 < in_EDX) {
    std::__cxx11::string::append((char *)in_RDI);
    std::__cxx11::string::append((ulong)in_RDI,(char)in_EDX * '\x02');
  }
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

std::string to_string(int level) const override
        {
            std::string s;
            if (level > 0)
            {
                s.append("\n");
                s.append(std::size_t(level)*2, ' ');
            }
            s.append("tokenize function");
            return s;
        }